

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O0

void __thiscall QPDFMatrix::QPDFMatrix(QPDFMatrix *this,Matrix *m)

{
  Matrix *m_local;
  QPDFMatrix *this_local;
  
  this->a = m->a;
  this->b = m->b;
  this->c = m->c;
  this->d = m->d;
  this->e = m->e;
  this->f = m->f;
  return;
}

Assistant:

QPDFMatrix::QPDFMatrix(QPDFObjectHandle::Matrix const& m) :
    a(m.a),
    b(m.b),
    c(m.c),
    d(m.d),
    e(m.e),
    f(m.f)
{
}